

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
::nosize_unchecked_emplace_at<std::__cxx11::string>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  group_type_pointer pgVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  group_type_pointer pgVar4;
  pointer pcVar5;
  ulong uVar6;
  uint uVar7;
  ushort uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  undefined8 *puVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  pgVar4 = arrays_->groups_;
  lVar10 = pos0 * 0x10;
  pgVar2 = pgVar4 + pos0;
  auVar14[0] = -(pgVar2->m[0].n == '\0');
  auVar14[1] = -(pgVar2->m[1].n == '\0');
  auVar14[2] = -(pgVar2->m[2].n == '\0');
  auVar14[3] = -(pgVar2->m[3].n == '\0');
  auVar14[4] = -(pgVar2->m[4].n == '\0');
  auVar14[5] = -(pgVar2->m[5].n == '\0');
  auVar14[6] = -(pgVar2->m[6].n == '\0');
  auVar14[7] = -(pgVar2->m[7].n == '\0');
  auVar14[8] = -(pgVar2->m[8].n == '\0');
  auVar14[9] = -(pgVar2->m[9].n == '\0');
  auVar14[10] = -(pgVar2->m[10].n == '\0');
  auVar14[0xb] = -(pgVar2->m[0xb].n == '\0');
  auVar14[0xc] = -(pgVar2->m[0xc].n == '\0');
  auVar14[0xd] = -(pgVar2->m[0xd].n == '\0');
  auVar14[0xe] = -(pgVar2->m[0xe].n == '\0');
  auVar14[0xf] = -(pgVar2->m[0xf].n == '\0');
  uVar12 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
  if (uVar12 == 0) {
    uVar6 = arrays_->groups_size_mask;
    lVar11 = 1;
    do {
      pgVar4[pos0].m[0xf].n = pgVar4[pos0].m[0xf].n | '\x01' << ((byte)hash & 7);
      pos0 = pos0 + lVar11 & uVar6;
      lVar10 = pos0 * 0x10;
      pgVar2 = pgVar4 + pos0;
      auVar15[0] = -(pgVar2->m[0].n == '\0');
      auVar15[1] = -(pgVar2->m[1].n == '\0');
      auVar15[2] = -(pgVar2->m[2].n == '\0');
      auVar15[3] = -(pgVar2->m[3].n == '\0');
      auVar15[4] = -(pgVar2->m[4].n == '\0');
      auVar15[5] = -(pgVar2->m[5].n == '\0');
      auVar15[6] = -(pgVar2->m[6].n == '\0');
      auVar15[7] = -(pgVar2->m[7].n == '\0');
      auVar15[8] = -(pgVar2->m[8].n == '\0');
      auVar15[9] = -(pgVar2->m[9].n == '\0');
      auVar15[10] = -(pgVar2->m[10].n == '\0');
      auVar15[0xb] = -(pgVar2->m[0xb].n == '\0');
      auVar15[0xc] = -(pgVar2->m[0xc].n == '\0');
      auVar15[0xd] = -(pgVar2->m[0xd].n == '\0');
      auVar15[0xe] = -(pgVar2->m[0xe].n == '\0');
      auVar15[0xf] = -(pgVar2->m[0xf].n == '\0');
      uVar8 = (ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe;
      uVar12 = (uint)uVar8;
      lVar11 = lVar11 + 1;
    } while (uVar8 == 0);
  }
  uVar7 = 0;
  if (uVar12 != 0) {
    for (; (uVar12 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
    }
  }
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&arrays_->elements_[pos0 * 0xf]._M_dataplus._M_p + (ulong)(uVar7 << 5));
  puVar13 = (undefined8 *)
            ((long)&arrays_->elements_[pos0 * 0xf]._M_dataplus._M_p + (ulong)(uVar7 << 5));
  *puVar13 = puVar13 + 2;
  pcVar5 = (args->_M_dataplus)._M_p;
  paVar1 = &args->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar9 = *(undefined8 *)((long)&args->field_2 + 8);
    puVar13[2] = paVar1->_M_allocated_capacity;
    puVar13[3] = uVar9;
  }
  else {
    (pbVar3->_M_dataplus)._M_p = pcVar5;
    (pbVar3->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  pbVar3->_M_string_length = args->_M_string_length;
  (args->_M_dataplus)._M_p = (pointer)paVar1;
  args->_M_string_length = 0;
  (args->field_2)._M_local_buf[0] = '\0';
  (pgVar4->m + lVar10)[uVar7].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + (hash & 0xff));
  __return_storage_ptr__->pg =
       (group15<boost::unordered::detail::foa::plain_integral> *)(pgVar4->m + lVar10);
  __return_storage_ptr__->n = uVar7;
  __return_storage_ptr__->p = pbVar3;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }